

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_ogf.cxx
# Opt level: O2

void __thiscall xray_re::xr_ogf::~xr_ogf(xr_ogf *this)

{
  (this->super_xr_object).super_xr_surface_factory._vptr_xr_surface_factory =
       (_func_int **)&PTR__xr_ogf_00239198;
  delete_elements<std::vector<xray_re::xr_ogf*,std::allocator<xray_re::xr_ogf*>>>(&this->m_children)
  ;
  delete_elements<std::vector<xray_re::xr_ogf*,std::allocator<xray_re::xr_ogf*>>>(&this->m_lods);
  std::_Vector_base<xray_re::xr_ogf_*,_std::allocator<xray_re::xr_ogf_*>_>::~_Vector_base
            (&(this->m_lods).
              super__Vector_base<xray_re::xr_ogf_*,_std::allocator<xray_re::xr_ogf_*>_>);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            (&(this->m_children_l).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
  std::_Vector_base<xray_re::xr_ogf_*,_std::allocator<xray_re::xr_ogf_*>_>::~_Vector_base
            (&(this->m_children).
              super__Vector_base<xray_re::xr_ogf_*,_std::allocator<xray_re::xr_ogf_*>_>);
  xr_ibuf::~xr_ibuf(&this->m_ib);
  xr_vbuf::~xr_vbuf(&this->m_vb);
  std::__cxx11::string::~string((string *)&this->m_shader);
  std::__cxx11::string::~string((string *)&this->m_texture);
  std::__cxx11::string::~string((string *)&this->m_path);
  xr_object::~xr_object(&this->super_xr_object);
  return;
}

Assistant:

xr_ogf::~xr_ogf()
{
	delete_elements(m_children);
	delete_elements(m_lods);
}